

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall QtMWidgets::DateTimePicker::setMaximumDateTime(DateTimePicker *this,QDateTime *dt)

{
  DateTimePickerPrivate *this_00;
  char cVar1;
  long lVar2;
  QDateTime *min;
  QDateTime m;
  QDateTime local_30 [8];
  QDate local_28;
  
  cVar1 = QDateTime::isValid();
  if (cVar1 != '\0') {
    lVar2 = QDateTime::date();
    QDate::QDate(&local_28,7999,0xc,0x1f);
    if (lVar2 <= local_28.jd) {
      QDateTime::toTimeSpec((TimeSpec)local_30);
      this_00 = (this->d).d;
      cVar1 = QDateTime::precedes(&this_00->minimum);
      min = &((this->d).d)->minimum;
      if (cVar1 == '\0') {
        min = local_30;
      }
      DateTimePickerPrivate::setRange(this_00,min,local_30);
      QDateTime::~QDateTime(local_30);
    }
  }
  return;
}

Assistant:

void
DateTimePicker::setMaximumDateTime( const QDateTime & dt )
{
	if( dt.isValid() && dt.date() <= DATETIMEPICKER_DATE_MAX )
	{
		const QDateTime m = dt.toTimeSpec( d->spec );
		d->setRange( ( d->minimum < m ? d->minimum : m ), m );
	}
}